

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::JobManager::PrepareStopJobs
          (Error *__return_storage_ptr__,JobManager *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids,bool aGroupAlias)

{
  uint64_t uVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  bool bVar2;
  uint uVar3;
  const_reference aStr;
  pointer ppVar4;
  element_type *peVar5;
  Error *aError;
  ErrorCode local_10c;
  Error local_108;
  allocator local_d9;
  string local_d8;
  byte local_b2;
  allocator local_b1;
  undefined1 local_b0 [6];
  bool active;
  _Self local_90;
  _Self local_88;
  iterator entry;
  unsigned_long *nid;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  string local_50;
  undefined1 local_2b;
  undefined1 local_2a;
  byte local_29;
  bool condition;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvStack_28;
  bool aGroupAlias_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids_local;
  Expression *aExpr_local;
  JobManager *this_local;
  Error *error;
  
  local_2a = 0;
  local_29 = aGroupAlias;
  pvStack_28 = aNids;
  aNids_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)aExpr;
  aExpr_local = (Expression *)this;
  this_local = (JobManager *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  aStr = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)aNids_local,0);
  utils::ToLower(&local_50,aStr);
  bVar2 = std::operator==(&local_50,"stop");
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = pvStack_28;
  local_2b = bVar2;
  if (!bVar2) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                  ,0x105,
                  "Error ot::commissioner::JobManager::PrepareStopJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                 );
  }
  __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvStack_28);
  nid = (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&nid);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    entry._M_node =
         (_Base_ptr)
         __gnu_cxx::
         __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         ::operator*(&__end2);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
         ::find(&this->mCommissionerPool,(key_type_conflict *)entry._M_node);
    local_90._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
         ::end(&this->mCommissionerPool);
    bVar2 = std::operator==(&local_88,&local_90);
    if (bVar2) {
      if ((local_29 & 1) == 0) {
        uVar1 = *(uint64_t *)entry._M_node;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_b0,"not known to be started",&local_b1);
        WarningMsg(this,uVar1,(string *)local_b0);
        std::__cxx11::string::~string((string *)local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      }
    }
    else {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>
               ::operator->(&local_88);
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ppVar4->second);
      uVar3 = (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
      local_b2 = (byte)uVar3 & 1;
      if ((uVar3 & 1) == 0) {
        if ((local_29 & 1) == 0) {
          uVar1 = *(uint64_t *)entry._M_node;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_d8,"already stopped",&local_d9);
          InfoMsg(this,uVar1,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        }
      }
      else {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>
                 ::operator->(&local_88);
        CreateJob(&local_108,this,&ppVar4->second,(Expression *)aNids_local,
                  *(uint64_t *)entry._M_node);
        aError = Error::operator=(__return_storage_ptr__,&local_108);
        local_10c = kNone;
        bVar2 = commissioner::operator!=(aError,&local_10c);
        Error::~Error(&local_108);
        if (bVar2) {
          return __return_storage_ptr__;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Error JobManager::PrepareStopJobs(const Interpreter::Expression &aExpr,
                                  const std::vector<uint64_t>   &aNids,
                                  bool                           aGroupAlias)
{
    Error error = ERROR_NONE;

    ASSERT(utils::ToLower(aExpr[0]) == "stop");

    for (const auto &nid : aNids)
    {
        auto entry = mCommissionerPool.find(nid);
        if (entry == mCommissionerPool.end())
        {
            if (!aGroupAlias)
            {
                WarningMsg(nid, "not known to be started");
            }
            continue;
        }

        bool active = entry->second->IsActive();
        if (!active)
        {
            if (!aGroupAlias)
            {
                InfoMsg(nid, "already stopped");
            }
            continue;
        }

        SuccessOrExit(error = CreateJob(entry->second, aExpr, nid));
    }
exit:
    return error;
}